

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
CoreML::LinearModel::getWeights
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,LinearModel *this)

{
  bool bVar1;
  element_type *this_00;
  GLMRegressor *this_01;
  RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray> *this_02;
  reference from;
  double local_b0;
  double n;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedField<double> *__range2;
  vector<double,_std::allocator<double>_> cur;
  GLMRegressor_DoubleArray v;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray> *__range1;
  GLMRegressor *lr;
  LinearModel *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_glmregressor(this_00);
  this_02 = Specification::GLMRegressor::weights(this_01);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::
           begin(this_02);
  v._32_8_ = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::
             end(this_02);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::
                 operator!=(&__end1,(iterator *)&v._value_cached_byte_size_), bVar1) {
    from = google::protobuf::internal::
           RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::operator*
                     (&__end1);
    Specification::GLMRegressor_DoubleArray::GLMRegressor_DoubleArray
              ((GLMRegressor_DoubleArray *)
               &cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,from);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&__range2);
    __begin2 = (const_iterator)
               Specification::GLMRegressor_DoubleArray::value
                         ((GLMRegressor_DoubleArray *)
                          &cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    __end2 = google::protobuf::RepeatedField<double>::begin((RepeatedField<double> *)__begin2);
    n = (double)google::protobuf::RepeatedField<double>::end((RepeatedField<double> *)__begin2);
    for (; __end2 != (const_iterator)n; __end2 = __end2 + 1) {
      local_b0 = *__end2;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&__range2,&local_b0);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&__range2);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&__range2);
    Specification::GLMRegressor_DoubleArray::~GLMRegressor_DoubleArray
              ((GLMRegressor_DoubleArray *)
               &cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::GLMRegressor_DoubleArray>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::vector<double>> LinearModel::getWeights() {
        std::vector< std::vector<double>> result;
        auto lr = m_spec->mutable_glmregressor();
        for(auto v : lr->weights()) {
            std::vector<double> cur;
            for(double n : v.value()) {
                cur.push_back(n);
            }
            result.push_back(cur);
        }
        return result;
    }